

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

void * flatcc_builder_extend_vector(flatcc_builder_t *B,size_t count)

{
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  p_Var2 = B->frame;
  uVar1 = (p_Var2->container).table.pl_end;
  uVar5 = (uint)count;
  uVar4 = uVar1 + uVar5;
  if ((CARRY4(uVar1,uVar5)) || ((p_Var2->container).table.vt_hash < uVar4)) {
    __assert_fail("n <= n1 && n1 <= max_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x391,
                  "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
                 );
  }
  (p_Var2->container).table.pl_end = uVar4;
  uVar1 = B->ds_offset;
  uVar4 = uVar5 * (B->frame->container).table.vs_end + uVar1;
  B->ds_offset = uVar4;
  if ((B->ds_limit <= uVar4) && (iVar3 = reserve_ds(B,(ulong)(uVar4 + 1),0xfffffffc), iVar3 != 0)) {
    return (void *)0x0;
  }
  return B->ds + uVar1;
}

Assistant:

void *flatcc_builder_extend_vector(flatcc_builder_t *B, size_t count)
{
    if (vector_count_add(B, (uoffset_t)count, frame(container.vector.max_count))) {
        return 0;
    }
    return push_ds(B, frame(container.vector.elem_size) * (uoffset_t)count);
}